

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

void __thiscall
slang::ast::Statement::StatementContext::observeTiming(StatementContext *this,TimingControl *timing)

{
  SourceLocation SVar1;
  ProceduralBlockSymbol *pPVar2;
  Diagnostic *this_00;
  
  pPVar2 = ASTContext::getProceduralBlock(this->rootAstContext);
  if (((pPVar2 != (ProceduralBlockSymbol *)0x0) && (pPVar2->procedureKind == AlwaysFF)) &&
     (timing->kind != Invalid)) {
    if (2 < timing->kind - SignalEvent) {
      ASTContext::addDiag(this->rootAstContext,(DiagCode)0x70008,timing->sourceRange);
      return;
    }
    if ((((ulong)(this->lastEventControl).startLoc & 0xfffffff) != 0) &&
       (((this->flags).m_bits & 0x10) == 0)) {
      this_00 = ASTContext::addDiag(this->rootAstContext,(DiagCode)0x8,timing->sourceRange);
      Diagnostic::addNote(this_00,(DiagCode)0xc0001,this->lastEventControl);
      *(byte *)&(this->flags).m_bits = (byte)(this->flags).m_bits | 0x10;
    }
    SVar1 = (timing->sourceRange).endLoc;
    (this->lastEventControl).startLoc = (timing->sourceRange).startLoc;
    (this->lastEventControl).endLoc = SVar1;
  }
  return;
}

Assistant:

void Statement::StatementContext::observeTiming(const TimingControl& timing) {
    auto proc = rootAstContext.getProceduralBlock();
    if (!proc || proc->procedureKind != ProceduralBlockKind::AlwaysFF || timing.bad())
        return;

    if (timing.kind != TimingControlKind::SignalEvent &&
        timing.kind != TimingControlKind::EventList &&
        timing.kind != TimingControlKind::ImplicitEvent) {
        rootAstContext.addDiag(diag::BlockingInAlwaysFF, timing.sourceRange);
        return;
    }

    if (lastEventControl.start() && !flags.has(StatementFlags::HasTimingError)) {
        auto& diag = rootAstContext.addDiag(diag::AlwaysFFEventControl, timing.sourceRange);
        diag.addNote(diag::NotePreviousUsage, lastEventControl);

        flags |= StatementFlags::HasTimingError;
    }

    lastEventControl = timing.sourceRange;
}